

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

lyd_diff_userord *
lyd_diff_userord_get(lyd_node *first,lysc_node *schema,lyd_diff_userord **userord)

{
  lyd_diff_userord *plVar1;
  lyd_diff_userord *plVar2;
  long lVar3;
  lyd_node *in_RAX;
  long *plVar4;
  lyd_node *siblings;
  lyd_node **pplVar5;
  lyd_diff_userord *plVar6;
  lyd_node **pplVar7;
  lyd_diff_userord *plVar8;
  lyd_node *iter;
  lyd_node *local_38;
  
  plVar8 = *userord;
  pplVar5 = (lyd_node **)0xffffffffffffffff;
  plVar6 = plVar8 + -1;
  while( true ) {
    if (plVar8 == (lyd_diff_userord *)0x0) {
      pplVar7 = (lyd_node **)0x0;
    }
    else {
      pplVar7 = plVar8[-1].inst;
    }
    pplVar5 = (lyd_node **)((long)pplVar5 + 1);
    if (pplVar7 <= pplVar5) break;
    plVar1 = plVar6 + 1;
    plVar2 = plVar6 + 1;
    plVar6 = plVar1;
    if (plVar2->schema == schema) {
      return plVar1;
    }
  }
  local_38 = in_RAX;
  if (plVar8 == (lyd_diff_userord *)0x0) {
    plVar4 = (long *)malloc(0x20);
    if (plVar4 != (long *)0x0) {
      *plVar4 = 1;
      goto LAB_00119046;
    }
  }
  else {
    pplVar5 = plVar8[-1].inst;
    plVar8[-1].inst = (lyd_node **)((long)pplVar5 + 1);
    plVar4 = (long *)realloc(&plVar8[-1].inst,(long)pplVar5 * 0x18 + 0x20);
    if (plVar4 != (long *)0x0) {
LAB_00119046:
      *userord = (lyd_diff_userord *)(plVar4 + 1);
      lVar3 = *plVar4;
      plVar8 = (lyd_diff_userord *)(plVar4 + lVar3 * 3 + -2);
      plVar8->schema = (lysc_node *)0x0;
      plVar8->pos = 0;
      plVar8->inst = (lyd_node **)0x0;
      plVar8->schema = schema;
      plVar8->pos = 0;
      plVar8->inst = (lyd_node **)0x0;
      if (first == (lyd_node *)0x0) {
        return plVar8;
      }
      siblings = lyd_first_sibling(first);
      lyd_find_sibling_val(siblings,first->schema,(char *)0x0,0,&local_38);
      if (local_38 == (lyd_node *)0x0) {
        return plVar8;
      }
      userord = (lyd_diff_userord **)(plVar4 + lVar3 * 3);
      do {
        if (local_38->schema != first->schema) {
          return plVar8;
        }
        plVar6 = *userord;
        if (plVar6 == (lyd_diff_userord *)0x0) {
          plVar4 = (long *)malloc(0x10);
          if (plVar4 == (long *)0x0) goto LAB_00119135;
          *plVar4 = 1;
        }
        else {
          pplVar5 = plVar6[-1].inst;
          plVar6[-1].inst = (lyd_node **)((long)pplVar5 + 1);
          plVar4 = (long *)realloc(&plVar6[-1].inst,(long)pplVar5 * 8 + 0x10);
          if (plVar4 == (long *)0x0) break;
        }
        *userord = (lyd_diff_userord *)(plVar4 + 1);
        lVar3 = *plVar4;
        plVar4[lVar3] = 0;
        plVar4[lVar3] = (long)local_38;
        local_38 = local_38->next;
        if (local_38 == (lyd_node *)0x0) {
          return plVar8;
        }
      } while( true );
    }
    (*userord)[-1].inst = (lyd_node **)((long)(*userord)[-1].inst + -1);
  }
LAB_00119135:
  ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
         "lyd_diff_userord_get");
  return (lyd_diff_userord *)0x0;
}

Assistant:

static struct lyd_diff_userord *
lyd_diff_userord_get(const struct lyd_node *first, const struct lysc_node *schema, struct lyd_diff_userord **userord)
{
    struct lyd_diff_userord *item;
    struct lyd_node *iter;
    const struct lyd_node **node;
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(*userord, u) {
        if ((*userord)[u].schema == schema) {
            return &(*userord)[u];
        }
    }

    /* it was not added yet, add it now */
    LY_ARRAY_NEW_RET(schema->module->ctx, *userord, item, NULL);

    item->schema = schema;
    item->pos = 0;
    item->inst = NULL;

    /* store all the instance pointers in the current order */
    if (first) {
        LYD_LIST_FOR_INST(lyd_first_sibling(first), first->schema, iter) {
            LY_ARRAY_NEW_RET(schema->module->ctx, item->inst, node, NULL);
            *node = iter;
        }
    }

    return item;
}